

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Apu.cpp
# Opt level: O3

void __thiscall
Gb_Apu::osc_output(Gb_Apu *this,int index,Blip_Buffer *center,Blip_Buffer *left,Blip_Buffer *right)

{
  Gb_Osc *pGVar1;
  
  pGVar1 = this->oscs[index];
  pGVar1->outputs[1] = right;
  pGVar1->outputs[2] = left;
  pGVar1->outputs[3] = center;
  pGVar1->output = pGVar1->outputs[pGVar1->output_select];
  return;
}

Assistant:

void Gb_Apu::osc_output( int index, Blip_Buffer* center, Blip_Buffer* left, Blip_Buffer* right )
{
	require( (unsigned) index < osc_count );
	require( (center && left && right) || (!center && !left && !right) );
	Gb_Osc& osc = *oscs [index];
	osc.outputs [1] = right;
	osc.outputs [2] = left;
	osc.outputs [3] = center;
	osc.output = osc.outputs [osc.output_select];
}